

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void ibfR4(float *ioptr,long M,long NDiffU)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar14 = ((ulong)(1L << (M & 0x3fU)) >> 2) / (ulong)NDiffU;
  pfVar1 = ioptr + NDiffU * 2;
  uVar10 = *(ulong *)ioptr;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar10;
  uVar11 = *(ulong *)pfVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar11;
  uVar12 = *(ulong *)(pfVar1 + NDiffU * 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar12;
  uVar13 = *(ulong *)(pfVar1 + NDiffU * 2 + NDiffU * 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar13;
  auVar19._0_4_ = (float)uVar11 + (float)uVar10;
  auVar19._4_4_ = (float)(uVar11 >> 0x20) + (float)(uVar10 >> 0x20);
  auVar19._8_8_ = 0;
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar21._0_4_ = (float)uVar13 + (float)uVar12;
  auVar21._4_4_ = (float)(uVar13 >> 0x20) + (float)(uVar12 >> 0x20);
  auVar21._8_8_ = 0;
  auVar17 = vsubps_avx(auVar18,auVar20);
  auVar16 = vmovlhps_avx(auVar17,auVar16);
  auVar17 = vmovlhps_avx(auVar19,auVar21);
  while( true ) {
    auVar15 = vmovshdup_avx(auVar16);
    auVar19 = vshufpd_avx(auVar16,auVar16,1);
    auVar21 = vshufps_avx(auVar16,auVar16,0xff);
    auVar18 = vmovshdup_avx(auVar17);
    auVar22 = vshufps_avx(auVar17,auVar17,0xff);
    fVar2 = ioptr[NDiffU * 6 + 2];
    fVar3 = ioptr[NDiffU * 6 + 3];
    fVar4 = ioptr[NDiffU * 2 + 2];
    fVar5 = ioptr[NDiffU * 2 + 3];
    fVar6 = ioptr[2];
    fVar7 = ioptr[3];
    uVar14 = uVar14 - 1;
    auVar20 = vshufpd_avx(auVar17,auVar17,1);
    fVar8 = ioptr[NDiffU * 4 + 2];
    fVar9 = ioptr[NDiffU * 4 + 3];
    ioptr[NDiffU * 6] = auVar19._0_4_ + auVar15._0_4_;
    *ioptr = auVar20._0_4_ + auVar17._0_4_;
    ioptr[NDiffU * 6 + 1] = auVar21._0_4_ - auVar16._0_4_;
    ioptr[1] = auVar22._0_4_ + auVar18._0_4_;
    ioptr[NDiffU * 2] = auVar19._0_4_ - auVar15._0_4_;
    ioptr[NDiffU * 4] = auVar17._0_4_ - auVar20._0_4_;
    ioptr[NDiffU * 2 + 1] = auVar21._0_4_ + auVar16._0_4_;
    ioptr[NDiffU * 4 + 1] = auVar18._0_4_ - auVar22._0_4_;
    auVar15 = vsubss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar5));
    auVar16 = vaddss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar5));
    auVar17 = vsubss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)fVar4));
    auVar18 = vaddss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)fVar4));
    auVar19 = vaddss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar8));
    auVar20 = vsubss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar3));
    fVar5 = auVar20._0_4_ * 0.70710677;
    fVar6 = auVar19._0_4_ * 0.70710677;
    fVar4 = (fVar2 + fVar9) * 0.70710677;
    fVar3 = (fVar9 - fVar2) * -0.70710677;
    fVar7 = auVar18._0_4_ - (fVar5 + fVar4);
    fVar2 = (auVar16._0_4_ - fVar6) + fVar3;
    fVar3 = fVar3 + auVar17._0_4_ + fVar6;
    fVar4 = fVar4 + (auVar15._0_4_ - fVar5);
    auVar19 = SUB6416(ZEXT464(0x40000000),0);
    auVar16 = vfmsub213ss_fma(auVar16,auVar19,ZEXT416((uint)fVar2));
    auVar17 = vfmsub213ss_fma(auVar17,auVar19,ZEXT416((uint)fVar3));
    auVar15 = vfmsub213ss_fma(auVar15,auVar19,ZEXT416((uint)fVar4));
    auVar18 = vfmsub213ss_fma(auVar18,auVar19,ZEXT416((uint)fVar7));
    if (uVar14 == 0) break;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)(ioptr + NDiffU * 0xc);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(ioptr + NDiffU * 0xe);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(ioptr + NDiffU * 10);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(ioptr + NDiffU * 8);
    auVar19 = vinsertps_avx(auVar22,ZEXT416((uint)ioptr[NDiffU * 8]),0x20);
    auVar20 = vinsertps_avx(auVar23,ZEXT416((uint)ioptr[NDiffU * 10]),0x20);
    auVar21 = vinsertps_avx(auVar24,ZEXT416((uint)ioptr[NDiffU * 0xc]),0x20);
    auVar22 = vinsertps_avx(auVar25,ZEXT416((uint)ioptr[NDiffU * 0xe]),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)ioptr[NDiffU * 8 + 1]),0x30);
    auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)ioptr[NDiffU * 10 + 1]),0x30);
    auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)ioptr[NDiffU * 0xc + 1]),0x30);
    auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)ioptr[NDiffU * 0xe + 1]),0x30);
    ioptr[NDiffU * 4 + 2] = fVar4;
    ioptr[NDiffU * 2 + 2] = fVar2;
    ioptr[NDiffU * 4 + 3] = fVar7;
    ioptr[NDiffU * 2 + 3] = fVar3;
    ioptr[NDiffU * 6 + 2] = auVar16._0_4_;
    ioptr[2] = auVar15._0_4_;
    ioptr[NDiffU * 6 + 3] = auVar17._0_4_;
    ioptr[3] = auVar18._0_4_;
    ioptr = ioptr + NDiffU * 8;
    auVar16 = vsubps_avx(auVar19,auVar20);
    auVar17._0_4_ = auVar21._0_4_ + auVar22._0_4_;
    auVar17._4_4_ = auVar21._4_4_ + auVar22._4_4_;
    auVar17._8_4_ = auVar21._8_4_ + auVar22._8_4_;
    auVar17._12_4_ = auVar21._12_4_ + auVar22._12_4_;
  }
  ioptr[NDiffU * 4 + 2] = fVar4;
  ioptr[NDiffU * 2 + 2] = fVar2;
  ioptr[NDiffU * 4 + 3] = fVar7;
  ioptr[NDiffU * 2 + 3] = fVar3;
  ioptr[NDiffU * 6 + 2] = auVar16._0_4_;
  ioptr[2] = auVar15._0_4_;
  ioptr[NDiffU * 6 + 3] = auVar17._0_4_;
  ioptr[3] = auVar18._0_4_;
  return;
}

Assistant:

static inline void ibfR4(float *ioptr, long M, long NDiffU){
/*** 1 radix 4 stage ***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long	pnexti;
unsigned long 	NSameU;
unsigned long 	SameUCnt;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;

float w1r = 1.0/MYROOT2; /* cos(pi/4)	*/
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t1r, t1i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 4;
pnexti =  pnext + 1;
pos = 2;
posi = pos+1;
NSameU = POW2(M) / 4 /NDiffU;	// 4 pts per butterfly
pstrt = ioptr;
p0r = pstrt;
p1r = pstrt+pinc;
p2r = p1r+pinc;
p3r = p2r+pinc;

		/* Butterflys		*/
		/*
		f0	-	-	f0	-	-	f4
		f1	-  1 -	f5	-	-	f5
		f2	-	-	f6	-  1 -	f6
		f3	-  1 -	f3	- -i -	f7
		*/
		/* Butterflys		*/
		/*
		f0	-	-	f4	-	-	f4
		f1	- -i -	t1	-	-	f5
		f2	-	-	f2	- w1 -	f6
		f3	- -i -	f7	- iw1-	f7
		*/

f0r = *p0r;
f1r = *p1r;
f2r = *p2r;
f3r = *p3r;
f0i = *(p0r + 1);
f1i = *(p1r + 1);
f2i = *(p2r + 1);
f3i = *(p3r + 1);

f5r = f0r - f1r;
f5i = f0i - f1i;
f0r = f0r + f1r;
f0i = f0i + f1i;

f6r = f2r + f3r;
f6i = f2i + f3i;
f3r = f2r - f3r;
f3i = f2i - f3i;

for (SameUCnt = NSameU-1; SameUCnt > 0 ; SameUCnt--){

	f7r = f5r + f3i;
	f7i = f5i - f3r;
	f5r = f5r - f3i;
	f5i = f5i + f3r;

	f4r = f0r + f6r;
	f4i = f0i + f6i;
	f6r = f0r - f6r;
	f6i = f0i - f6i;

	f2r = *(p2r + pos);
	f2i = *(p2r + posi);
	f1r = *(p1r + pos);
	f1i = *(p1r + posi);
	f3i = *(p3r + posi);
	f0r = *(p0r + pos);
	f3r = *(p3r + pos);
	f0i = *(p0r + posi);

	*p3r = f7r;
	*p0r = f4r;
	*(p3r + 1) = f7i;
	*(p0r + 1) = f4i;
	*p1r = f5r;
	*p2r = f6r;
	*(p1r + 1) = f5i;
	*(p2r + 1) = f6i;

	f7r = f2r + f3i;
	f7i = f2i - f3r;
	f2r = f2r - f3i;
	f2i = f2i + f3r;

	f4r = f0r - f1i;
	f4i = f0i + f1r;
	t1r = f0r + f1i;
	t1i = f0i - f1r;

	f5r = t1r - f7r * w1r - f7i * w1r;
	f5i = t1i + f7r * w1r - f7i * w1r;
	f7r = t1r * Two - f5r;
	f7i = t1i * Two - f5i;

	f6r = f4r - f2r * w1r + f2i * w1r;
	f6i = f4i - f2r * w1r - f2i * w1r;
	f4r = f4r * Two - f6r;
	f4i = f4i * Two - f6i;

	f3r = *(p3r + pnext);
	f0r = *(p0r + pnext);
	f3i = *(p3r + pnexti);
	f0i = *(p0r + pnexti);
	f2r = *(p2r + pnext);
	f2i = *(p2r + pnexti);
	f1r = *(p1r + pnext);
	f1i = *(p1r + pnexti);

	*(p2r + pos) = f6r;
	*(p1r + pos) = f5r;
	*(p2r + posi) = f6i;
	*(p1r + posi) = f5i;
	*(p3r + pos) = f7r;
	*(p0r + pos) = f4r;
	*(p3r + posi) = f7i;
	*(p0r + posi) = f4i;

	f6r = f2r + f3r;
	f6i = f2i + f3i;
	f3r = f2r - f3r;
	f3i = f2i - f3i;

	f5r = f0r - f1r;
	f5i = f0i - f1i;
	f0r = f0r + f1r;
	f0i = f0i + f1i;

	p3r += pnext;
	p0r += pnext;
	p1r += pnext;
	p2r += pnext;

}
f7r = f5r + f3i;
f7i = f5i - f3r;
f5r = f5r - f3i;
f5i = f5i + f3r;

f4r = f0r + f6r;
f4i = f0i + f6i;
f6r = f0r - f6r;
f6i = f0i - f6i;

f2r = *(p2r + pos);
f2i = *(p2r + posi);
f1r = *(p1r + pos);
f1i = *(p1r + posi);
f3i = *(p3r + posi);
f0r = *(p0r + pos);
f3r = *(p3r + pos);
f0i = *(p0r + posi);

*p3r = f7r;
*p0r = f4r;
*(p3r + 1) = f7i;
*(p0r + 1) = f4i;
*p1r = f5r;
*p2r = f6r;
*(p1r + 1) = f5i;
*(p2r + 1) = f6i;

f7r = f2r + f3i;
f7i = f2i - f3r;
f2r = f2r - f3i;
f2i = f2i + f3r;

f4r = f0r - f1i;
f4i = f0i + f1r;
t1r = f0r + f1i;
t1i = f0i - f1r;

f5r = t1r - f7r * w1r - f7i * w1r;
f5i = t1i + f7r * w1r - f7i * w1r;
f7r = t1r * Two - f5r;
f7i = t1i * Two - f5i;

f6r = f4r - f2r * w1r + f2i * w1r;
f6i = f4i - f2r * w1r - f2i * w1r;
f4r = f4r * Two - f6r;
f4i = f4i * Two - f6i;

*(p2r + pos) = f6r;
*(p1r + pos) = f5r;
*(p2r + posi) = f6i;
*(p1r + posi) = f5i;
*(p3r + pos) = f7r;
*(p0r + pos) = f4r;
*(p3r + posi) = f7i;
*(p0r + posi) = f4i;

}